

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControllerBlogPost.cpp
# Opt level: O1

string * __thiscall
Angelsen::ControllerBlogPost::get
          (string *__return_storage_ptr__,ControllerBlogPost *this,string *blogPath)

{
  size_type *psVar1;
  pointer pcVar2;
  long *plVar3;
  string *psVar4;
  size_type *psVar5;
  Template t;
  WebFile blog;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  Template local_c8;
  WebFile local_70;
  
  psVar1 = &local_c8.sourceCode._M_string_length;
  pcVar2 = (this->config_->templateDir)._M_dataplus._M_p;
  local_c8._vptr_Template = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + (this->config_->templateDir)._M_string_length);
  std::__cxx11::string::append((char *)&local_c8);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c8,(ulong)(blogPath->_M_dataplus)._M_p);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_148.field_2._M_allocated_capacity = *psVar5;
    local_148.field_2._8_8_ = plVar3[3];
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  }
  else {
    local_148.field_2._M_allocated_capacity = *psVar5;
    local_148._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_148._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  EasyWeb::WebFile::WebFile(&local_70,&local_148,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (local_c8._vptr_Template != (_func_int **)psVar1) {
    operator_delete(local_c8._vptr_Template,local_c8.sourceCode._M_string_length + 1);
  }
  psVar4 = EasyWeb::WebFile::file_abi_cxx11_
                     ((this->config_->template_)._M_t.
                      super___uniq_ptr_impl<EasyWeb::WebFile,_std::default_delete<EasyWeb::WebFile>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_EasyWeb::WebFile_*,_std::default_delete<EasyWeb::WebFile>_>
                      .super__Head_base<0UL,_EasyWeb::WebFile_*,_false>._M_head_impl);
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar2,pcVar2 + psVar4->_M_string_length);
  Jinja2CppLight::Template::Template(&local_c8,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"body","");
  psVar4 = EasyWeb::WebFile::file_abi_cxx11_(&local_70);
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar2,pcVar2 + psVar4->_M_string_length);
  Jinja2CppLight::Template::setValue(&local_c8,&local_108,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  Jinja2CppLight::Template::render_abi_cxx11_(__return_storage_ptr__,&local_c8);
  Jinja2CppLight::Template::~Template(&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.file_._M_dataplus._M_p != &local_70.file_.field_2) {
    operator_delete(local_70.file_._M_dataplus._M_p,local_70.file_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.filePath_._M_dataplus._M_p != &local_70.filePath_.field_2) {
    operator_delete(local_70.filePath_._M_dataplus._M_p,
                    local_70.filePath_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ControllerBlogPost::get(const std::string& blogPath)
{
    EasyWeb::WebFile blog(config_.templateDir + "/" + blogPath, false);

    Jinja2CppLight::Template t(config_.template_->file());
    t.setValue("body", blog.file());

    return t.render();
}